

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O2

void __thiscall File::File(File *this,char *fName,uint oflag,uint systemDependentFlags)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *this_00;
  string local_1c0 [32];
  ostringstream ss;
  
  (this->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream =
       (_func_int **)&PTR__File_0024cce8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_name,fName,(allocator<char> *)&ss);
  this->m_pos = 0;
  uVar1 = anon_unknown.dwarf_38976e::makeUnixOpenFlags(oflag);
  iVar2 = open64(fName,systemDependentFlags | uVar1,0x1b0);
  if (iVar2 != -1) {
    this->m_impl = (void *)(long)iVar2;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&ss,"Error opening file ");
  poVar3 = std::operator<<(poVar3,fName);
  poVar3 = std::operator<<(poVar3,": ");
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3,"(");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  std::operator<<(poVar3,")");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

File::File(const char* fName, unsigned int oflag, unsigned int systemDependentFlags) : m_name(fName), m_pos(0)
{
    int sysFlags = makeUnixOpenFlags(oflag);
    auto fd = ::open(fName, sysFlags | systemDependentFlags, S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP);
    if (fd == -1)
    {
        std::ostringstream ss;
        ss << "Error opening file " << fName << ": " << strerror(errno) << "(" << errno << ")";
        throw std::runtime_error(ss.str());
    }
    m_impl = from_fd(fd);
}